

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_writer.c
# Opt level: O0

void SendCloseMsgs(SstStream Stream)

{
  SstStream in_RDI;
  _WriterCloseMsg Msg;
  undefined1 auStack_18 [8];
  ssize_t local_10;
  
  memset(auStack_18,0,0x10);
  local_10 = in_RDI->LastProvidedTimestep;
  CP_verbose(in_RDI,PerStepVerbose,
             "SstWriterClose, Sending Close at Timestep %ld, one to each reader\n",local_10);
  sendOneToEachReaderRank(Stream,(CMFormat)Msg.FinalTimestep,Msg.RS_Stream,&in_RDI->CPInfo);
  in_RDI->CloseMessagesSent = 1;
  return;
}

Assistant:

static void SendCloseMsgs(SstStream Stream)
{
    struct _WriterCloseMsg Msg;
    STREAM_ASSERT_LOCKED(Stream);
    memset(&Msg, 0, sizeof(Msg));
    Msg.FinalTimestep = Stream->LastProvidedTimestep;
    CP_verbose(Stream, PerStepVerbose,
               "SstWriterClose, Sending Close at Timestep %ld, one to each reader\n",
               Msg.FinalTimestep);

    sendOneToEachReaderRank(Stream, Stream->CPInfo->SharedCM->WriterCloseFormat, &Msg,
                            &Msg.RS_Stream);
    Stream->CloseMessagesSent = 1;
}